

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32_t tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  double *pdVar4;
  uint8_t *puVar5;
  int32_t *piVar6;
  float *pfVar7;
  uint32_t *puVar8;
  FieldDescriptor FVar9;
  bool bVar10;
  Limit limit;
  int iVar11;
  UnknownFieldSet *pUVar12;
  Message *pMVar13;
  int64_t iVar14;
  unsigned_long uVar15;
  uint64_t value_00;
  ulong uVar16;
  undefined4 extraout_var;
  EnumDescriptor *this;
  EnumValueDescriptor *value_01;
  int32_t value_02;
  _Alloc_hider _Var17;
  Reflection *this_00;
  uint32_t uVar18;
  int key;
  uint first_byte_or_zero;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  float value_03;
  pair<unsigned_long,_bool> pVar20;
  double value;
  string local_e0;
  Limit local_bc;
  FieldDescriptor *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  if (field == (FieldDescriptor *)0x0) goto LAB_003bb738;
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,&local_b8)
    ;
  }
  FVar9 = field[2];
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)(byte)FVar9 * 4)) {
    if ((~(byte)field[1] & 0x60) != 0) {
LAB_003bb738:
      pUVar12 = Reflection::MutableUnknownFields(this_00,message);
      bVar10 = SkipField(input,tag,pUVar12);
      return bVar10;
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,
                 &local_b8);
      FVar9 = field[2];
    }
    if (((tag & 7) != 2) || (0xfffffffb < (byte)FVar9 - 0xd)) goto LAB_003bb738;
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      first_byte_or_zero = (uint)*pbVar3;
      if ((char)*pbVar3 < '\0') goto LAB_003bbc95;
      input->buffer_ = pbVar3 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_003bbc95:
      iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      first_byte_or_zero = (uint)iVar14;
      if (iVar14 < 0) {
        return false;
      }
    }
    limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,
                 &local_b8);
    }
    switch(field[2]) {
    case (FieldDescriptor)0x1:
      iVar11 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar11) {
        do {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_e0);
            _Var17._M_p = local_e0._M_dataplus._M_p;
            if (!bVar10) {
              return false;
            }
          }
          else {
            _Var17._M_p = (pointer)*pdVar4;
            input->buffer_ = (uint8_t *)(pdVar4 + 1);
          }
          Reflection::AddDouble(this_00,message,field,(double)_Var17._M_p);
          iVar11 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar11);
      }
      break;
    case (FieldDescriptor)0x2:
      iVar11 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar11) {
        do {
          pfVar7 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar7 < 4) {
            bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_e0);
            if (!bVar10) {
              return false;
            }
            value_03 = local_e0._M_dataplus._M_p._0_4_;
          }
          else {
            value_03 = *pfVar7;
            input->buffer_ = (uint8_t *)(pfVar7 + 1);
          }
          Reflection::AddFloat(this_00,message,field,value_03);
          iVar11 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar11);
      }
      break;
    case (FieldDescriptor)0x3:
      while (iVar11 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar11) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar15 = (unsigned_long)(char)*puVar5, -1 < (long)uVar15)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddInt64(this_00,message,field,uVar15);
      }
      break;
    case (FieldDescriptor)0x4:
      while (iVar11 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar11) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (value_00 = (uint64_t)(char)*puVar5, -1 < (long)value_00)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          value_00 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddUInt64(this_00,message,field,value_00);
      }
      break;
    case (FieldDescriptor)0x5:
      while (iVar11 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar11) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar16 = (ulong)bVar2;
          uVar18 = (uint32_t)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003bbf14;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar18 = 0;
LAB_003bbf14:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
          if ((long)uVar16 < 0) {
            return false;
          }
        }
        Reflection::AddInt32(this_00,message,field,(int32_t)uVar16);
      }
      break;
    case (FieldDescriptor)0x6:
      iVar11 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar11) {
        do {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_e0);
            if (!bVar10) {
              return false;
            }
          }
          else {
            local_e0._M_dataplus._M_p = (pointer)*pdVar4;
            input->buffer_ = (uint8_t *)(pdVar4 + 1);
          }
          Reflection::AddUInt64(this_00,message,field,(uint64_t)local_e0._M_dataplus._M_p);
          iVar11 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar11);
      }
      break;
    case (FieldDescriptor)0x7:
      iVar11 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar11) {
        do {
          puVar8 = (uint32_t *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar8 < 4) {
            bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_e0);
            if (!bVar10) {
              return false;
            }
            uVar18 = (uint32_t)local_e0._M_dataplus._M_p._0_4_;
          }
          else {
            uVar18 = *puVar8;
            local_e0._M_dataplus._M_p._0_4_ = (float)uVar18;
            input->buffer_ = (uint8_t *)(puVar8 + 1);
          }
          Reflection::AddUInt32(this_00,message,field,uVar18);
          iVar11 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar11);
      }
      break;
    case (FieldDescriptor)0x8:
      while (iVar11 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar11) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar15 = (unsigned_long)(char)*puVar5, -1 < (long)uVar15)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddBool(this_00,message,field,uVar15 != 0);
      }
      break;
    case (FieldDescriptor)0x9:
    case (FieldDescriptor)0xa:
    case (FieldDescriptor)0xb:
    case (FieldDescriptor)0xc:
      goto LAB_003bc29c;
    case (FieldDescriptor)0xd:
      while (iVar11 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar11) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar16 = (ulong)bVar2;
          uVar18 = (uint32_t)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003bbdc4;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar18 = 0;
LAB_003bbdc4:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
          if ((long)uVar16 < 0) {
            return false;
          }
        }
        Reflection::AddUInt32(this_00,message,field,(uint32_t)uVar16);
      }
      break;
    case (FieldDescriptor)0xe:
      iVar11 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar11) {
        local_bc = limit;
        do {
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar2 = *pbVar3;
            uVar16 = (ulong)bVar2;
            uVar18 = (uint32_t)bVar2;
            if ((char)bVar2 < '\0') goto LAB_003bc192;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar18 = 0;
LAB_003bc192:
            uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
            if ((long)uVar16 < 0) {
              return false;
            }
          }
          iVar11 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
          key = (int)uVar16;
          if (*(char *)(*(long *)(CONCAT44(extraout_var,iVar11) + 0x10) + 0x3a) == '\x03') {
            Reflection::AddEnumValue(this_00,message,field,key);
          }
          else {
            this = FieldDescriptor::enum_type(field);
            value_01 = EnumDescriptor::FindValueByNumber(this,key);
            if (value_01 == (EnumValueDescriptor *)0x0) {
              pUVar12 = Reflection::MutableUnknownFields(this_00,message);
              UnknownFieldSet::AddVarint(pUVar12,tag >> 3,(long)key);
            }
            else {
              Reflection::AddEnum(this_00,message,field,value_01);
            }
          }
          limit = local_bc;
          iVar11 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar11);
      }
      break;
    case (FieldDescriptor)0xf:
      iVar11 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar11) {
        do {
          piVar6 = (int32_t *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)piVar6 < 4) {
            bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_e0);
            if (!bVar10) {
              return false;
            }
            value_02 = (int32_t)local_e0._M_dataplus._M_p._0_4_;
          }
          else {
            value_02 = *piVar6;
            input->buffer_ = (uint8_t *)(piVar6 + 1);
          }
          Reflection::AddInt32(this_00,message,field,value_02);
          iVar11 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar11);
      }
      break;
    case (FieldDescriptor)0x10:
      iVar11 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar11) {
        do {
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_e0);
            _Var17._M_p = local_e0._M_dataplus._M_p;
            if (!bVar10) {
              return false;
            }
          }
          else {
            _Var17._M_p = (pointer)*pdVar4;
            input->buffer_ = (uint8_t *)(pdVar4 + 1);
          }
          Reflection::AddInt64(this_00,message,field,(int64_t)_Var17._M_p);
          iVar11 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar11);
      }
      break;
    case (FieldDescriptor)0x11:
      while (iVar11 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar11) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar16 = (ulong)bVar2;
          uVar18 = (uint32_t)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003bbd17;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar18 = 0;
LAB_003bbd17:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
          if ((long)uVar16 < 0) {
            return false;
          }
        }
        Reflection::AddInt32
                  (this_00,message,field,-((uint)uVar16 & 1) ^ (uint)(uVar16 >> 1) & 0x7fffffff);
      }
      break;
    case (FieldDescriptor)0x12:
      while (iVar11 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar11) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar16 = (ulong)(char)*puVar5, -1 < (long)uVar16)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar16 = pVar20.first;
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddInt64(this_00,message,field,-(ulong)((uint)uVar16 & 1) ^ uVar16 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_e0,&local_b8)
    ;
    FVar9 = field[2];
  }
  switch(FVar9) {
  case (FieldDescriptor)0x1:
    bVar10 = WireFormatLite::
             ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                       (input,(double *)&local_e0);
    if (!bVar10) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddDouble(this_00,message,field,(double)local_e0._M_dataplus._M_p);
      return true;
    }
    Reflection::SetDouble(this_00,message,field,(double)local_e0._M_dataplus._M_p);
    return true;
  case (FieldDescriptor)0x2:
    bVar10 = WireFormatLite::
             ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                       (input,(float *)&local_e0);
    if (!bVar10) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddFloat(this_00,message,field,local_e0._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,local_e0._M_dataplus._M_p._0_4_);
    }
    break;
  case (FieldDescriptor)0x3:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) &&
       (_Var17._M_p = (pointer)(long)(char)*puVar5, -1 < (long)_Var17._M_p)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
      _Var17._M_p = (pointer)pVar20.first;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    FVar9 = field[1];
    goto LAB_003bbb11;
  case (FieldDescriptor)0x4:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) &&
       (_Var17._M_p = (pointer)(long)(char)*puVar5, -1 < (long)_Var17._M_p)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
      _Var17._M_p = (pointer)pVar20.first;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    FVar9 = field[1];
    goto LAB_003bbb4b;
  case (FieldDescriptor)0x5:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                       (input,(int32_t *)&local_e0);
    goto LAB_003bb7fd;
  case (FieldDescriptor)0x6:
    pdVar4 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
      bVar10 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_e0);
      if (!bVar10) {
        return false;
      }
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)*pdVar4;
      input->buffer_ = (uint8_t *)(pdVar4 + 1);
    }
    FVar9 = field[1];
    _Var17._M_p = local_e0._M_dataplus._M_p;
LAB_003bbb4b:
    if ((~(byte)FVar9 & 0x60) == 0) {
      Reflection::AddUInt64(this_00,message,field,(uint64_t)_Var17._M_p);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,(uint64_t)_Var17._M_p);
    }
    break;
  case (FieldDescriptor)0x7:
    puVar5 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
      bVar10 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_e0);
      goto LAB_003bb836;
    }
    local_e0._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar5;
    input->buffer_ = puVar5 + 4;
    goto LAB_003bb9f4;
  case (FieldDescriptor)0x8:
    bVar10 = WireFormatLite::
             ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                       (input,(bool *)&local_e0);
    if (!bVar10) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddBool(this_00,message,field,local_e0._M_dataplus._M_p._0_1_);
    }
    else {
      Reflection::SetBool(this_00,message,field,local_e0._M_dataplus._M_p._0_1_);
    }
    break;
  case (FieldDescriptor)0x9:
    cVar1 = *(char *)(*(long *)(field + 0x10) + 0x3a);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar10 = WireFormatLite::ReadBytes(input,&local_e0);
    if (!bVar10) {
LAB_003bba96:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
        return false;
      }
      operator_delete(local_e0._M_dataplus._M_p);
      return false;
    }
    if (cVar1 == '\x03') {
      bVar10 = WireFormatLite::VerifyUtf8String
                         (local_e0._M_dataplus._M_p,(int)local_e0._M_string_length,PARSE,
                          *(char **)(*(long *)(field + 8) + 0x20));
      if (!bVar10) goto LAB_003bba96;
    }
    else {
      WireFormatLite::VerifyUtf8String
                (local_e0._M_dataplus._M_p,(int)local_e0._M_string_length,PARSE,
                 *(char **)(*(long *)(field + 8) + 0x20));
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      paVar19 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::AddString(this_00,message,field,&local_50);
      _Var17._M_p = local_50._M_dataplus._M_p;
    }
    else {
      paVar19 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::SetString(this_00,message,field,&local_70);
      _Var17._M_p = local_70._M_dataplus._M_p;
    }
    goto LAB_003bbc71;
  case (FieldDescriptor)0xa:
    if ((~(byte)field[1] & 0x60) == 0) {
      pMVar13 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar13 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar10 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar13);
    goto LAB_003bbaeb;
  case (FieldDescriptor)0xb:
    if ((~(byte)field[1] & 0x60) == 0) {
      pMVar13 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar13 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar10 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar13);
LAB_003bbaeb:
    if (bVar10 == false) {
      return false;
    }
    return true;
  case (FieldDescriptor)0xc:
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar10 = WireFormatLite::ReadBytes(input,&local_e0);
    if (!bVar10) goto LAB_003bba96;
    if ((~(byte)field[1] & 0x60) == 0) {
      paVar19 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::AddString(this_00,message,field,&local_90);
      _Var17._M_p = local_90._M_dataplus._M_p;
    }
    else {
      paVar19 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::SetString(this_00,message,field,&local_b0);
      _Var17._M_p = local_b0._M_dataplus._M_p;
    }
LAB_003bbc71:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var17._M_p != paVar19) {
      operator_delete(_Var17._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    break;
  case (FieldDescriptor)0xd:
    bVar10 = WireFormatLite::
             ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                       (input,(uint32_t *)&local_e0);
LAB_003bb836:
    if (bVar10 == false) {
      return false;
    }
LAB_003bb9f4:
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddUInt32(this_00,message,field,(uint32_t)local_e0._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetUInt32(this_00,message,field,(uint32_t)local_e0._M_dataplus._M_p._0_4_);
    }
    break;
  case (FieldDescriptor)0xe:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                       (input,(int *)&local_e0);
    if (!bVar10) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddEnumValue(this_00,message,field,(int)local_e0._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,(int)local_e0._M_dataplus._M_p._0_4_);
    }
    break;
  case (FieldDescriptor)0xf:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                       (input,(int32_t *)&local_e0);
    goto LAB_003bb7fd;
  case (FieldDescriptor)0x10:
    bVar10 = WireFormatLite::
             ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                       (input,(int64_t *)&local_e0);
    goto LAB_003bb94f;
  case (FieldDescriptor)0x11:
    bVar10 = WireFormatLite::
             ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                       (input,(int32_t *)&local_e0);
LAB_003bb7fd:
    if (bVar10 == false) {
LAB_003bc29c:
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddInt32(this_00,message,field,(int32_t)local_e0._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetInt32(this_00,message,field,(int32_t)local_e0._M_dataplus._M_p._0_4_);
    }
    break;
  case (FieldDescriptor)0x12:
    bVar10 = WireFormatLite::
             ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                       (input,(int64_t *)&local_e0);
LAB_003bb94f:
    if (bVar10 == false) {
      return false;
    }
    FVar9 = field[1];
    _Var17._M_p = local_e0._M_dataplus._M_p;
LAB_003bbb11:
    if ((~(byte)FVar9 & 0x60) == 0) {
      Reflection::AddInt64(this_00,message,field,(int64_t)_Var17._M_p);
      return true;
    }
    Reflection::SetInt64(this_00,message,field,(int64_t)_Var17._M_p);
    return true;
  }
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32_t tag,
    const FieldDescriptor* field,  // May be nullptr for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == nullptr) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32_t length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != nullptr) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64_t sign_extended_value = static_cast<int64_t>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32_t, Int32)
      HANDLE_TYPE(INT64, int64_t, Int64)
      HANDLE_TYPE(SINT32, int32_t, Int32)
      HANDLE_TYPE(SINT64, int64_t, Int64)
      HANDLE_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}